

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Clear(Extension *this)

{
  byte bVar1;
  MessageLite *pMVar2;
  Arena *pAVar3;
  LogMessage *pLVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->is_repeated == true) {
    bVar1 = this->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar4 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_51,pLVar4);
      LogMessage::~LogMessage(&local_50);
    }
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      ((this->field_0).repeated_int32_value)->current_size_ = 0;
      break;
    case 9:
      RepeatedPtrFieldBase::
      Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                ((RepeatedPtrFieldBase *)(this->field_0).string_value);
      break;
    case 10:
      RepeatedPtrFieldBase::
      Clear<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                ((RepeatedPtrFieldBase *)(this->field_0).string_value);
    }
  }
  else if ((this->field_0xa & 1) == 0) {
    bVar1 = this->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar4 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_51,pLVar4);
      LogMessage::~LogMessage(&local_50);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 10) {
      pAVar3 = (((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_;
      if ((this->field_0xa & 0x10) == 0) {
        (**(code **)(pAVar3 + 0x38))();
      }
      else {
        (**(code **)(pAVar3 + 0x68))();
      }
    }
    else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 9) {
      pMVar2 = (this->field_0).message_value;
      pMVar2[1]._vptr_MessageLite = (_func_int **)0x0;
      *(undefined1 *)pMVar2->_vptr_MessageLite = 0;
    }
    this->field_0xa = (this->field_0xa & 0xf0) + 1;
  }
  return;
}

Assistant:

void ExtensionSet::Extension::Clear() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                          \
      case WireFormatLite::CPPTYPE_##UPPERCASE:                    \
        repeated_##LOWERCASE##_value->Clear();                     \
        break

      HANDLE_TYPE(  INT32,   int32);
      HANDLE_TYPE(  INT64,   int64);
      HANDLE_TYPE( UINT32,  uint32);
      HANDLE_TYPE( UINT64,  uint64);
      HANDLE_TYPE(  FLOAT,   float);
      HANDLE_TYPE( DOUBLE,  double);
      HANDLE_TYPE(   BOOL,    bool);
      HANDLE_TYPE(   ENUM,    enum);
      HANDLE_TYPE( STRING,  string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    if (!is_cleared) {
      switch (cpp_type(type)) {
        case WireFormatLite::CPPTYPE_STRING:
          string_value->clear();
          break;
        case WireFormatLite::CPPTYPE_MESSAGE:
          if (is_lazy) {
            lazymessage_value->Clear();
          } else {
            message_value->Clear();
          }
          break;
        default:
          // No need to do anything.  Get*() will return the default value
          // as long as is_cleared is true and Set*() will overwrite the
          // previous value.
          break;
      }

      is_cleared = true;
    }
  }
}